

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roipooling.cpp
# Opt level: O0

int __thiscall
ncnn::ROIPooling::forward
          (ROIPooling *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  int *piVar2;
  float *pfVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  float fVar4;
  double dVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar6;
  int index;
  int x;
  int y;
  float max;
  bool is_empty;
  int wend;
  int hend;
  int wstart;
  int hstart;
  int pw;
  int ph;
  float *outptr;
  float *ptr;
  int q;
  float bin_size_h;
  float bin_size_w;
  int roi_h;
  int roi_w;
  int roi_y2;
  int roi_x2;
  int roi_y1;
  int roi_x1;
  float *roi_ptr;
  Mat *top_blob;
  Mat *roi_blob;
  int channels;
  size_t elemsize;
  int h;
  int w;
  Mat *bottom_blob;
  float local_1b8;
  undefined4 in_stack_fffffffffffffe50;
  float in_stack_fffffffffffffe54;
  float in_stack_fffffffffffffe58;
  undefined3 uVar7;
  undefined4 in_stack_fffffffffffffe5c;
  undefined8 in_stack_fffffffffffffe60;
  int _c;
  Mat *pMVar8;
  undefined8 in_stack_fffffffffffffe68;
  Mat *in_stack_fffffffffffffe70;
  int local_170;
  int local_16c;
  float local_168;
  char local_161;
  int local_160 [5];
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  Mat local_138;
  float *local_f8;
  Mat local_e0;
  float *local_a0;
  int local_94;
  float local_90;
  float local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  float *local_60;
  reference local_58;
  const_reference local_50;
  int local_44;
  size_t local_40;
  int local_38;
  int local_34;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  _c = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_34 = local_30->w;
  local_38 = local_30->h;
  local_40 = local_30->elemsize;
  local_44 = local_30->c;
  local_50 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_58 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  Mat::create(in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
              (int)in_stack_fffffffffffffe68,_c,
              CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
              (Allocator *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_60 = Mat::operator_cast_to_float_(local_50);
    dVar5 = std::round((double)(ulong)(uint)(*local_60 * *(float *)(in_RDI + 0x88)));
    local_64 = (int)SUB84(dVar5,0);
    dVar5 = std::round((double)(ulong)(uint)(local_60[1] * *(float *)(in_RDI + 0x88)));
    local_68 = (int)SUB84(dVar5,0);
    dVar5 = std::round((double)(ulong)(uint)(local_60[2] * *(float *)(in_RDI + 0x88)));
    local_6c = (int)SUB84(dVar5,0);
    dVar5 = std::round((double)(ulong)(uint)(local_60[3] * *(float *)(in_RDI + 0x88)));
    local_70 = (int)SUB84(dVar5,0);
    local_78 = (local_6c - local_64) + 1;
    local_7c = 1;
    piVar2 = std::max<int>(&local_78,&local_7c);
    local_74 = *piVar2;
    local_84 = (local_70 - local_68) + 1;
    local_88 = 1;
    piVar2 = std::max<int>(&local_84,&local_88);
    local_80 = *piVar2;
    local_8c = (float)local_74 / (float)*(int *)(in_RDI + 0x80);
    local_90 = (float)local_80 / (float)*(int *)(in_RDI + 0x84);
    for (local_94 = 0; local_94 < local_44; local_94 = local_94 + 1) {
      pMVar8 = &local_e0;
      Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                   (int)in_stack_fffffffffffffe54);
      pfVar3 = Mat::operator_cast_to_float_(pMVar8);
      Mat::~Mat((Mat *)0x178d2c);
      pMVar8 = &local_138;
      local_a0 = pfVar3;
      Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                   (int)in_stack_fffffffffffffe54);
      pfVar3 = Mat::operator_cast_to_float_(pMVar8);
      Mat::~Mat((Mat *)0x178d78);
      uVar6 = extraout_XMM0_Db;
      local_f8 = pfVar3;
      for (local_13c = 0; local_13c < *(int *)(in_RDI + 0x84); local_13c = local_13c + 1) {
        for (local_140 = 0; local_140 < *(int *)(in_RDI + 0x80); local_140 = local_140 + 1) {
          fVar4 = (float)local_68;
          dVar5 = std::floor((double)CONCAT44(uVar6,(float)local_13c * local_90));
          local_144 = (int)(fVar4 + SUB84(dVar5,0));
          fVar4 = (float)local_64;
          dVar5 = std::floor((double)(ulong)(uint)((float)local_140 * local_8c));
          local_148 = (int)(fVar4 + SUB84(dVar5,0));
          in_stack_fffffffffffffe54 = (float)local_68;
          dVar5 = std::ceil((double)(ulong)(uint)((float)(local_13c + 1) * local_90));
          local_14c = (int)(in_stack_fffffffffffffe54 + SUB84(dVar5,0));
          in_stack_fffffffffffffe58 = (float)local_64;
          dVar5 = std::ceil((double)(ulong)(uint)((float)(local_140 + 1) * local_8c));
          local_160[4] = (int)(in_stack_fffffffffffffe58 + SUB84(dVar5,0));
          local_160[3] = 0;
          piVar2 = std::max<int>(&local_144,local_160 + 3);
          piVar2 = std::min<int>(piVar2,&local_38);
          local_144 = *piVar2;
          local_160[2] = 0;
          piVar2 = std::max<int>(&local_148,local_160 + 2);
          piVar2 = std::min<int>(piVar2,&local_34);
          local_148 = *piVar2;
          local_160[1] = 0;
          piVar2 = std::max<int>(&local_14c,local_160 + 1);
          piVar2 = std::min<int>(piVar2,&local_38);
          local_14c = *piVar2;
          local_160[0] = 0;
          piVar2 = std::max<int>(local_160 + 4,local_160);
          piVar2 = std::min<int>(piVar2,&local_34);
          local_160[4] = *piVar2;
          uVar7 = (undefined3)in_stack_fffffffffffffe5c;
          in_stack_fffffffffffffe5c = CONCAT13(1,uVar7);
          if (local_144 < local_14c) {
            in_stack_fffffffffffffe5c = CONCAT13(local_160[4] <= local_148,uVar7);
          }
          local_161 = (char)((uint)in_stack_fffffffffffffe5c >> 0x18);
          if (local_161 == '\0') {
            local_1b8 = local_a0[local_144 * local_34 + local_148];
          }
          else {
            local_1b8 = 0.0;
          }
          local_168 = local_1b8;
          for (local_16c = local_144; local_16c < local_14c; local_16c = local_16c + 1) {
            for (local_170 = local_148; local_170 < local_160[4]; local_170 = local_170 + 1) {
              pfVar3 = std::max<float>(&local_168,local_a0 + (local_16c * local_34 + local_170));
              local_168 = *pfVar3;
            }
          }
          uVar6 = 0;
          local_f8[local_140] = local_168;
        }
        local_f8 = local_f8 + *(int *)(in_RDI + 0x80);
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ROIPooling::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    int roi_x1 = round(roi_ptr[0] * spatial_scale);
    int roi_y1 = round(roi_ptr[1] * spatial_scale);
    int roi_x2 = round(roi_ptr[2] * spatial_scale);
    int roi_y2 = round(roi_ptr[3] * spatial_scale);

    int roi_w = std::max(roi_x2 - roi_x1 + 1, 1);
    int roi_h = std::max(roi_y2 - roi_y1 + 1, 1);

    float bin_size_w = (float)roi_w / (float)pooled_width;
    float bin_size_h = (float)roi_h / (float)pooled_height;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        for (int ph = 0; ph < pooled_height; ph++)
        {
            for (int pw = 0; pw < pooled_width; pw++)
            {
                // Compute pooling region for this output unit:
                //  start (included) = floor(ph * roi_height / pooled_height)
                //  end (excluded) = ceil((ph + 1) * roi_height / pooled_height)
                int hstart = roi_y1 + floor((float)(ph) * bin_size_h);
                int wstart = roi_x1 + floor((float)(pw) * bin_size_w);
                int hend = roi_y1 + ceil((float)(ph + 1) * bin_size_h);
                int wend = roi_x1 + ceil((float)(pw + 1) * bin_size_w);

                hstart = std::min(std::max(hstart, 0), h);
                wstart = std::min(std::max(wstart, 0), w);
                hend = std::min(std::max(hend, 0), h);
                wend = std::min(std::max(wend, 0), w);

                bool is_empty = (hend <= hstart) || (wend <= wstart);

                float max = is_empty ? 0.f : ptr[hstart * w + wstart];

                for (int y = hstart; y < hend; y++)
                {
                    for (int x = wstart; x < wend; x++)
                    {
                        int index = y * w + x;
                        max = std::max(max, ptr[index]);
                    }
                }

                outptr[pw] = max;
            }

            outptr += pooled_width;
        }
    }

    return 0;
}